

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# export_ostream.cpp
# Opt level: O3

void __thiscall pstore::exchange::export_ns::ostream::~ostream(ostream *this)

{
  pointer pcVar1;
  size_t sVar2;
  
  sVar2 = ostream_base::buffered_chars(&this->super_ostream_base);
  (*(this->super_ostream_base)._vptr_ostream_base[2])
            (this,&(this->super_ostream_base).buffer_,sVar2);
  pcVar1 = (this->super_ostream_base).buffer_.super__Vector_base<char,_std::allocator<char>_>.
           _M_impl.super__Vector_impl_data._M_start;
  (this->super_ostream_base).ptr_ = pcVar1;
  (this->super_ostream_base)._vptr_ostream_base = (_func_int **)&PTR___cxa_pure_virtual_0023b430;
  if (pcVar1 != (pointer)0x0) {
    operator_delete(pcVar1,(long)(this->super_ostream_base).buffer_.
                                 super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage - (long)pcVar1);
    return;
  }
  return;
}

Assistant:

ostream::~ostream () noexcept {
                PSTORE_TRY {
                    this->flush ();
                    // clang-format off
                }